

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_encrypt.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte *pbVar1;
  uint uVar2;
  FILE *pFVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  mbedtls_rsa_context rsa;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [512];
  mbedtls_entropy_context entropy;
  uchar input [1024];
  mbedtls_rsa_context local_cd0;
  mbedtls_ctr_drbg_context local_b80;
  byte local_a28 [512];
  mbedtls_entropy_context local_828;
  uchar local_428 [1024];
  
  if (argc != 2) {
    puts("usage: rsa_encrypt <string of max 100 characters>");
    exit(1);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_rsa_init(&local_cd0,0,0);
  mbedtls_ctr_drbg_init(&local_b80);
  mbedtls_entropy_init(&local_828);
  uVar2 = mbedtls_ctr_drbg_seed
                    (&local_b80,mbedtls_entropy_func,&local_828,(uchar *)"rsa_encrypt",0xb);
  if (uVar2 == 0) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_pub.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      pcVar7 = " failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n";
LAB_0010640e:
      puts(pcVar7);
    }
    else {
      uVar2 = mbedtls_mpi_read_file(&local_cd0.N,0x10,(FILE *)pFVar3);
      if (uVar2 == 0) {
        uVar2 = mbedtls_mpi_read_file(&local_cd0.E,0x10,(FILE *)pFVar3);
        if (uVar2 == 0) {
          sVar4 = mbedtls_mpi_bitlen(&local_cd0.N);
          local_cd0.len = sVar4 + 7 >> 3;
          fclose(pFVar3);
          pcVar7 = argv[1];
          sVar5 = strlen(pcVar7);
          if (sVar5 < 0x65) {
            memcpy(local_428,pcVar7,sVar5);
            printf("\n  . Generating the RSA encrypted value");
            fflush(_stdout);
            sVar5 = strlen(argv[1]);
            uVar2 = mbedtls_rsa_pkcs1_encrypt
                              (&local_cd0,mbedtls_ctr_drbg_random,&local_b80,0,sVar5,local_428,
                               local_a28);
            if (uVar2 != 0) {
              pcVar7 = " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n";
              goto LAB_0010637e;
            }
            pFVar3 = fopen("result-enc.txt","wb+");
            if (pFVar3 != (FILE *)0x0) {
              if (local_cd0.len != 0) {
                uVar8 = 0;
                do {
                  pbVar1 = local_a28 + uVar8;
                  uVar8 = uVar8 + 1;
                  pcVar7 = " ";
                  if ((uVar8 & 0xf) == 0) {
                    pcVar7 = "\r\n";
                  }
                  fprintf(pFVar3,"%02X%s",(ulong)*pbVar1,pcVar7);
                } while (uVar8 < local_cd0.len);
              }
              fclose(pFVar3);
              iVar6 = 0;
              printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
              goto LAB_00106418;
            }
            printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
            goto LAB_00106413;
          }
          pcVar7 = " Input data larger than 100 characters.\n";
          goto LAB_0010640e;
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)uVar2);
      fclose(pFVar3);
    }
  }
  else {
    pcVar7 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
LAB_0010637e:
    printf(pcVar7,(ulong)uVar2);
  }
LAB_00106413:
  iVar6 = 1;
LAB_00106418:
  mbedtls_ctr_drbg_free(&local_b80);
  mbedtls_entropy_free(&local_828);
  mbedtls_rsa_free(&local_cd0);
  return iVar6;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int return_val, exit_val;
    size_t i;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "rsa_encrypt";

    exit_val = MBEDTLS_EXIT_SUCCESS;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_encrypt <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    return_val = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                        &entropy, (const unsigned char *) pers,
                                        strlen( pers ) );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",
                        return_val );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( return_val = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( return_val = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n",
                        return_val );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    if( strlen( argv[1] ) > 100 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[1], strlen( argv[1] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA encrypted value" );
    fflush( stdout );

    return_val = mbedtls_rsa_pkcs1_encrypt( &rsa, mbedtls_ctr_drbg_random,
                                            &ctr_drbg, MBEDTLS_RSA_PUBLIC,
                                            strlen( argv[1] ), input, buf );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",
                        return_val );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

exit:
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_val );
}